

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

size_t collcoa_hash(void *a)

{
  return (long)*(int *)((long)a + 8) * 5 + *(long *)((long)a + 0x10) * 3 + *a * 2;
}

Assistant:

static size_t collcoa_hash( const void * a )
{
    const coll_request_t * x = a;
    return ((size_t) x->coll)*2 +
           ((size_t) x->group)*3 +
            5*x->root ; 
}